

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void phys_page_set(AddressSpaceDispatch *d,hwaddr index,uint64_t nb,uint16_t leaf)

{
  uint uVar1;
  Node *paPVar2;
  uint uVar3;
  uint64_t local_20;
  hwaddr local_18;
  
  uVar3 = (d->map).nodes_nb + 0x12;
  local_20 = nb;
  local_18 = index;
  if ((d->map).nodes_nb_alloc < uVar3) {
    uVar1 = d->uc->alloc_hint;
    if (uVar3 < uVar1) {
      uVar3 = uVar1;
    }
    (d->map).nodes_nb_alloc = uVar3;
    paPVar2 = (Node *)g_realloc_n((d->map).nodes,(ulong)uVar3,0x800);
    (d->map).nodes = paPVar2;
    d->uc->alloc_hint = (d->map).nodes_nb_alloc;
  }
  phys_page_set_level(&d->map,&d->phys_map,&local_18,&local_20,leaf,5);
  return;
}

Assistant:

static void phys_page_set(AddressSpaceDispatch *d,
                          hwaddr index, uint64_t nb,
                          uint16_t leaf)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = d->uc;
#endif
    /* Wildly overreserve - it doesn't matter much. */
    phys_map_node_reserve(d, &d->map, 3 * P_L2_LEVELS);

    phys_page_set_level(&d->map, &d->phys_map, &index, &nb, leaf, P_L2_LEVELS - 1);
}